

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.h
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityReissnerOrthotropic::~ChElasticityReissnerOrthotropic
          (ChElasticityReissnerOrthotropic *this)

{
  operator_delete(this,0x50);
  return;
}

Assistant:

class ChApi ChElasticityReissnerOrthotropic : public ChElasticityReissner {
  public:
    /// Construct an orthotropic material
    ChElasticityReissnerOrthotropic   (double m_E_x,    ///< Young's modulus on x
                                       double m_E_y,    ///< Young's modulus on y
                                       double m_nu_xy,  ///< Poisson ratio xy (for yx it holds: nu_yx*E_x = nu_xy*E_y)
                                       double m_G_xy,   ///< Shear modulus, in plane
                                       double m_G_xz,   ///< Shear modulus, transverse
                                       double m_G_yz,   ///< Shear modulus, transverse
                                       double m_alpha = 1.0,  ///< shear factor
                                       double m_beta = 0.1    ///< torque factor
    );
    /// Construct an orthotropic material as sub case isotropic
    ChElasticityReissnerOrthotropic   (double m_E,            ///< Young's modulus on x
                                       double m_nu,           ///< Poisson ratio
                                       double m_alpha = 1.0,  ///< shear factor
                                       double m_beta = 0.1    ///< torque factor
    );

    /// Return the elasticity moduli, on x
    double Get_E_x() const { return E_x; }
    /// Return the elasticity moduli, on y
    double Get_E_y() const { return E_y; }
    /// Return the Poisson ratio, for xy
    double Get_nu_xy() const { return nu_xy; }
    /// Return the Poisson ratio, for yx (follows xy as it must be nu_yx*E_x = nu_xy*E_y)
    double Get_nu_yx() const { return nu_xy * (E_y / E_x); }
    /// Return the shear mod, in plane
    double Get_G_xy() const { return G_xy; }
    /// Return the shear mod, transverse
    double Get_G_xz() const { return G_xz; }
    /// Return the shear mod, transverse
    double Get_G_yz() const { return G_yz; }
    /// Return the shear factor
    double Get_alpha() const { return alpha; }
    /// Return the torque factor
    double Get_beta() const { return beta; }

    /// The FE code will evaluate this function to compute
    /// per-unit-length forces/torques  given the u,v strains/curvatures.
    virtual void ComputeStress(
        ChVector<>& n_u,          ///< forces along \e u direction (per unit length)
        ChVector<>& n_v,          ///< forces along \e v direction (per unit length)
        ChVector<>& m_u,          ///< torques along \e u direction (per unit length)
        ChVector<>& m_v,          ///< torques along \e v direction (per unit length)
        const ChVector<>& eps_u,  ///< strains along \e u direction
        const ChVector<>& eps_v,  ///< strains along \e v direction
        const ChVector<>& kur_u,  ///< curvature along \e u direction
        const ChVector<>& kur_v,  ///< curvature along \e v direction
        const double z_inf,       ///< layer lower z value (along thickness coord)
        const double z_sup,       ///< layer upper z value (along thickness coord)
        const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
    );

    /// /// Compute the 12x12 stiffness matrix [Km] , that is [ds/de], the tangent of the constitutive relation
    /// stresses/strains. 
	virtual void ComputeStiffnessMatrix(
        ChMatrixRef mC,           ///< tangent matrix
        const ChVector<>& eps_u,  ///< strains along \e u direction
        const ChVector<>& eps_v,  ///< strains along \e v direction
        const ChVector<>& kur_u,  ///< curvature along \e u direction
        const ChVector<>& kur_v,  ///< curvature along \e v direction
        const double z_inf,       ///< layer lower z value (along thickness coord)
        const double z_sup,       ///< layer upper z value (along thickness coord)
        const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
    );

  private:
    double E_x;    ///< elasticity moduli
    double E_y;    ///< elasticity moduli
    double nu_xy;  ///< Poisson ratio
    double G_xy;   ///< Shear factor, in plane
    double G_xz;   ///< Shear factor, out of plane
    double G_yz;   ///< Shear factor, out of plane
    double alpha;  ///< shear factor
    double beta;   ///< torque factor
}